

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

void slang::setBits(uint64_t *dest,uint32_t destOffset,uint32_t length)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (length != 0) {
    puVar1 = dest + (destOffset >> 6);
    uVar3 = destOffset & 0x3f;
    if (uVar3 != 0) {
      uVar2 = 0x40 - uVar3;
      if (length <= 0x40 - uVar3) {
        uVar2 = length;
      }
      length = length - uVar2;
      *puVar1 = *puVar1 | ~(-1L << ((byte)uVar2 & 0x3f)) << (sbyte)uVar3;
      puVar1 = puVar1 + 1;
    }
    for (lVar4 = 0; length >> 6 != (uint)lVar4; lVar4 = lVar4 + 1) {
      puVar1[lVar4] = 0xffffffffffffffff;
    }
    if ((length & 0x3f) != 0) {
      puVar1[lVar4] = puVar1[lVar4] | ~(-1L << (sbyte)(length & 0x3f));
    }
  }
  return;
}

Assistant:

static void setBits(uint64_t* dest, uint32_t destOffset, uint32_t length) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        *dest |= ((1ull << bitsToWrite) - 1) << destOffset;
        dest++;
    }

    // Do a bulk set of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++)
        *dest++ = UINT64_MAX;

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord)
        *dest |= (1ull << length) - 1;
}